

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

SNode * new_SNode(Parser *p,D_State *state,d_loc_t *loc,D_Scope *sc)

{
  uint32 *puVar1;
  uint32 uVar2;
  SNode *s;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  SNode *sn;
  
  sn = p->free_snodes;
  if (sn == (SNode *)0x0) {
    sn = (SNode *)malloc(0x78);
  }
  else {
    p->free_snodes = sn->all_next;
  }
  (sn->zns).n = 0;
  (sn->zns).v = (ZNode **)0x0;
  *(undefined8 *)&sn->refcount = 0;
  sn->all_next = (SNode *)0x0;
  p->states = p->states + 1;
  sn->state = state;
  sn->initial_scope = sc;
  sn->last_pn = (PNode *)0x0;
  pcVar3 = loc->pathname;
  pcVar4 = loc->ws;
  iVar5 = loc->col;
  iVar6 = loc->line;
  (sn->loc).s = loc->s;
  (sn->loc).pathname = pcVar3;
  (sn->loc).ws = pcVar4;
  (sn->loc).col = iVar5;
  (sn->loc).line = iVar6;
  insert_SNode_internal(p,sn);
  uVar2 = sn->refcount;
  sn->refcount = uVar2 + 1;
  sn->all_next = (p->snode_hash).all;
  (p->snode_hash).all = sn;
  if (sn->state->accept != '\0') {
    s = p->accept;
    if (s == (SNode *)0x0) {
      sn->refcount = uVar2 + 2;
    }
    else {
      if ((sn->loc).s <= (s->loc).s) {
        return sn;
      }
      sn->refcount = uVar2 + 2;
      puVar1 = &s->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_SNode(p,s);
      }
    }
    p->accept = sn;
  }
  return sn;
}

Assistant:

static SNode *new_SNode(Parser *p, D_State *state, d_loc_t *loc, D_Scope *sc) {
  SNode *sn = p->free_snodes;
  if (!sn)
    sn = MALLOC(sizeof *sn);
  else
    p->free_snodes = sn->all_next;
  sn->depth = 0;
  sn->in_error_recovery_queue = 0;
  vec_clear(&sn->zns);
#ifndef USE_GC
  sn->refcount = 0;
#endif
  sn->all_next = 0;
  p->states++;
  sn->state = state;
  sn->initial_scope = sc;
  sn->last_pn = NULL;
  sn->loc = *loc;
  insert_SNode(p, sn);
  if (sn->state->accept) {
    if (!p->accept) {
      ref_sn(sn);
      p->accept = sn;
    } else if (sn->loc.s > p->accept->loc.s) {
      ref_sn(sn);
      unref_sn(p, p->accept);
      p->accept = sn;
    }
  }
  return sn;
}